

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O0

obj * realloc_obj(obj *obj,int oextra_size,void *oextra_src,int oname_size,char *name)

{
  boolean bVar1;
  obj *obj_00;
  obj *local_48;
  obj *inside;
  boolean save_twoweap;
  obj *otmp;
  char *name_local;
  int oname_size_local;
  void *oextra_src_local;
  int oextra_size_local;
  obj *obj_local;
  
  obj_00 = (obj *)malloc((ulong)(uint)(oextra_size + oname_size) + 0x68);
  memcpy(obj_00,obj,0x68);
  if (oextra_size == 0) {
    *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xff9fffff;
  }
  else if (oextra_src != (void *)0x0) {
    memcpy(obj_00->oextra,oextra_src,(long)oextra_size);
  }
  obj_00->oxlth = (short)oextra_size;
  obj_00->onamelth = (uchar)oname_size;
  if ((oname_size != 0) && (name != (char *)0x0)) {
    strcpy((char *)((long)obj_00->oextra + (long)(int)obj_00->oxlth),name);
  }
  bVar1 = u.twoweap;
  if (obj->olev == (level *)0x0) {
    obj->where = '\0';
    obj->timed = '\0';
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfff7ffff;
  }
  else {
    if (obj->owornmask != 0) {
      setworn((obj *)0x0,(long)obj->owornmask);
      setworn(obj_00,(long)obj_00->owornmask);
    }
    u.twoweap = bVar1;
    replace_object(obj,obj_00);
    if (obj->cobj != (obj *)0x0) {
      for (local_48 = obj->cobj; local_48 != (obj *)0x0; local_48 = local_48->nobj) {
        (local_48->v).v_nexthere = obj_00;
      }
    }
    obj_00->timed = '\0';
    if (obj->timed != '\0') {
      obj_move_timers(obj,obj_00);
    }
    *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xfff7ffff;
    if ((*(uint *)&obj->field_0x4a >> 0x13 & 1) != 0) {
      obj_move_light_source(obj,obj_00);
    }
    if (obj->oclass == '\a') {
      food_substitution(obj,obj_00);
    }
    else if (obj->oclass == '\n') {
      book_substitution(obj,obj_00);
    }
  }
  dealloc_obj(obj);
  return obj_00;
}

Assistant:

struct obj *realloc_obj(struct obj *obj, int oextra_size, void *oextra_src,
			int oname_size, const char *name)
{
	struct obj *otmp;

	otmp = newobj(oextra_size + oname_size);
	*otmp = *obj;	/* the cobj pointer is copied to otmp */
	if (oextra_size) {
	    if (oextra_src)
		memcpy(otmp->oextra, oextra_src, oextra_size);
	} else {
	    otmp->oattached = OATTACHED_NOTHING;
	}
	otmp->oxlth = oextra_size;
	otmp->onamelth = oname_size;
	
	if (oname_size) {
	    if (name)
		strcpy(ONAME(otmp), name);
	}

	/* !obj->olev means the obj is currently being restored and no pointer
	 * from or to it is valid. Re-equipping, timer linking, etc. will happen
	 * elsewhere in that case. */
	if (obj->olev) { 
	    if (obj->owornmask) {
		    boolean save_twoweap = u.twoweap;
		    /* unwearing the old instance will clear dual-wield mode
		    if this object is either of the two weapons */
		    setworn(NULL, obj->owornmask);
		    setworn(otmp, otmp->owornmask);
		    u.twoweap = save_twoweap;
	    }

	    /* replace obj with otmp */
	    replace_object(obj, otmp);

	    /* fix ocontainer pointers */
	    if (Has_contents(obj)) {
		    struct obj *inside;

		    for (inside = obj->cobj; inside; inside = inside->nobj)
			    inside->ocontainer = otmp;
	    }

	    /* move timers and light sources from obj to otmp */
	    otmp->timed = 0;	/* not timed, yet */
	    if (obj->timed) obj_move_timers(obj, otmp);
	    otmp->lamplit = 0;	/* ditto */
	    if (obj->lamplit) obj_move_light_source(obj, otmp);

	    /* objects possibly being manipulated by multi-turn occupations
	    which have been interrupted but might be subsequently resumed */
	    if (obj->oclass == FOOD_CLASS)
		food_substitution(obj, otmp);	/* eat food or open tin */
	    else if (obj->oclass == SPBOOK_CLASS)
		book_substitution(obj, otmp);	/* read spellbook */
	} else {
	    /* make sure dealloc_obj doesn't explode */
	    obj->where = OBJ_FREE;
	    obj->timed = FALSE;
	    obj->lamplit = FALSE;
	}
	/* obfree(obj, otmp);	now unnecessary: no pointers on bill */
	dealloc_obj(obj);	/* let us hope nobody else saved a pointer */
	return otmp;
}